

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O1

int __thiscall
TRootHandler_MNDX::SearchMndxInfo
          (TRootHandler_MNDX *this,char *szFileName,DWORD dwPackage,PMNDX_ROOT_ENTRY *ppRootEntry)

{
  PMNDX_ROOT_ENTRY p_Var1;
  int iVar2;
  PMNDX_ROOT_ENTRY p_Var3;
  uint uVar4;
  int iVar5;
  TMndxSearch Search;
  TMndxSearch local_58;
  
  local_58.pStruct40 = (TStruct40 *)0x0;
  local_58.szSearchMask = (char *)0x0;
  local_58.cchSearchMask = 0;
  local_58.szFoundPath = (char *)0x0;
  local_58.cchFoundPath = 0;
  local_58.FileNameIndex = 0;
  iVar5 = 2;
  if ((this->MndxInfo).bRootFileLoaded == true) {
    local_58.cchSearchMask = strlen(szFileName);
    local_58.szSearchMask = szFileName;
    iVar2 = TMndxMarFile::SearchFile((this->MndxInfo).MarFiles[1],&local_58);
    if ((iVar2 == 0) && (local_58.FileNameIndex < (this->MndxInfo).MndxEntriesValid)) {
      p_Var3 = this->ppValidEntries[local_58.FileNameIndex];
      uVar4 = p_Var3->Flags;
      while ((uVar4 & 0xffffff) != dwPackage) {
        if ((int)uVar4 < 0) goto LAB_00118038;
        p_Var1 = p_Var3 + 1;
        p_Var3 = p_Var3 + 1;
        uVar4 = p_Var1->Flags;
      }
      iVar5 = 0;
      if (ppRootEntry != (PMNDX_ROOT_ENTRY *)0x0) {
        *ppRootEntry = p_Var3;
        iVar5 = 0;
      }
    }
  }
LAB_00118038:
  TMndxSearch::FreeStruct40(&local_58);
  return iVar5;
}

Assistant:

TMndxSearch()
    {
        szSearchMask = NULL;
        cchSearchMask = 0;
        szFoundPath = NULL;
        cchFoundPath = 0;
        FileNameIndex = 0;
        pStruct40 = NULL;
    }